

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O1

int ncnn::reduction_op<ncnn::reduction_op_sumsq<float>,ncnn::reduction_op_add<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_c,Option *opt)

{
  float fVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  int *piVar7;
  uint uVar8;
  uint uVar9;
  void *pvVar10;
  long lVar11;
  void *pvVar12;
  int unaff_EBP;
  bool bVar13;
  ulong uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  void *pvVar18;
  ulong uVar19;
  ulong uVar20;
  uint uVar21;
  ulong uVar22;
  float fVar23;
  Mat sums;
  Mat local_78;
  
  sVar4 = a->elemsize;
  iVar2 = a->dims;
  if (iVar2 == 2) {
    uVar9 = a->w;
    uVar16 = (ulong)uVar9;
    uVar8 = a->h;
    uVar17 = (ulong)uVar8;
    if (reduce_w && reduce_h) {
      Mat::create(b,1,sVar4,opt->blob_allocator);
      local_78.cstep = 0;
      local_78.data = (void *)0x0;
      local_78.refcount._0_4_ = 0;
      local_78.refcount._4_4_ = 0;
      local_78.elemsize._0_4_ = 0;
      local_78.elemsize._4_4_ = 0;
      local_78.elempack = 0;
      local_78.allocator = (Allocator *)0x0;
      local_78.dims = 0;
      local_78.w = 0;
      local_78.h = 0;
      local_78.d = 0;
      local_78.c = 0;
      Mat::create(&local_78,uVar8,sVar4,opt->workspace_allocator);
      unaff_EBP = -100;
      if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
        if (0 < (int)uVar8) {
          pvVar10 = a->data;
          iVar3 = a->w;
          sVar5 = a->elemsize;
          uVar14 = 0;
          do {
            fVar23 = 0.0;
            if (0 < (int)uVar9) {
              uVar19 = 0;
              do {
                fVar1 = *(float *)((long)pvVar10 + uVar19 * 4);
                fVar23 = fVar23 + fVar1 * fVar1;
                uVar19 = uVar19 + 1;
              } while (uVar16 != uVar19);
            }
            *(float *)((long)local_78.data + uVar14 * 4) = fVar23;
            uVar14 = uVar14 + 1;
            pvVar10 = (void *)((long)pvVar10 + (long)iVar3 * sVar5);
          } while (uVar14 != uVar17);
        }
        fVar23 = 0.0;
        if (0 < (int)uVar8) {
          uVar16 = 0;
          do {
            fVar23 = fVar23 + *(float *)((long)local_78.data + uVar16 * 4);
            uVar16 = uVar16 + 1;
          } while (uVar17 != uVar16);
        }
        *(float *)b->data = fVar23;
        unaff_EBP = 0;
      }
      piVar7 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
            if (local_78.data != (void *)0x0) {
              free(local_78.data);
            }
          }
          else {
            (*(local_78.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      bVar13 = false;
    }
    else if (reduce_w && !reduce_h) {
      Mat::create(b,uVar8,sVar4,opt->blob_allocator);
      if (0 < (int)uVar8) {
        pvVar10 = a->data;
        iVar3 = a->w;
        sVar5 = a->elemsize;
        pvVar12 = b->data;
        uVar14 = 0;
        do {
          fVar23 = 0.0;
          if (0 < (int)uVar9) {
            uVar19 = 0;
            do {
              fVar1 = *(float *)((long)pvVar10 + uVar19 * 4);
              fVar23 = fVar23 + fVar1 * fVar1;
              uVar19 = uVar19 + 1;
            } while (uVar16 != uVar19);
          }
          *(float *)((long)pvVar12 + uVar14 * 4) = fVar23;
          uVar14 = uVar14 + 1;
          pvVar10 = (void *)((long)pvVar10 + (long)iVar3 * sVar5);
        } while (uVar14 != uVar17);
        goto LAB_002148e4;
      }
      bVar13 = false;
      unaff_EBP = 0;
    }
    else if (reduce_h && !reduce_w) {
      Mat::create(b,uVar9,sVar4,opt->blob_allocator);
      uVar15 = b->c * (int)b->cstep;
      if (0 < (int)uVar15) {
        memset(b->data,0,(ulong)uVar15 << 2);
      }
      if (0 < (int)uVar8) {
        pvVar10 = a->data;
        iVar3 = a->w;
        sVar5 = a->elemsize;
        pvVar12 = b->data;
        uVar14 = 0;
        do {
          if (0 < (int)uVar9) {
            uVar19 = 0;
            do {
              fVar23 = *(float *)((long)pvVar10 + uVar19 * 4);
              *(float *)((long)pvVar12 + uVar19 * 4) =
                   fVar23 * fVar23 + *(float *)((long)pvVar12 + uVar19 * 4);
              uVar19 = uVar19 + 1;
            } while (uVar16 != uVar19);
          }
          uVar14 = uVar14 + 1;
          pvVar10 = (void *)((long)pvVar10 + (long)iVar3 * sVar5);
        } while (uVar14 != uVar17);
      }
LAB_002148e4:
      bVar13 = false;
      unaff_EBP = 0;
    }
    else {
      bVar13 = true;
    }
    if (!bVar13) {
      return unaff_EBP;
    }
  }
  else if (iVar2 == 1) {
    iVar2 = a->w;
    Mat::create(b,1,sVar4,opt->blob_allocator);
    if ((long)iVar2 < 1) {
      fVar23 = 0.0;
    }
    else {
      fVar23 = 0.0;
      lVar11 = 0;
      do {
        fVar1 = *(float *)((long)a->data + lVar11 * 4);
        fVar23 = fVar23 + fVar1 * fVar1;
        lVar11 = lVar11 + 1;
      } while (iVar2 != lVar11);
    }
    *(float *)b->data = fVar23;
    return 0;
  }
  if (iVar2 != 3) {
    return 0;
  }
  uVar9 = a->w;
  uVar16 = (ulong)uVar9;
  uVar8 = a->h;
  uVar17 = (ulong)uVar8;
  uVar15 = a->c;
  uVar14 = (ulong)uVar15;
  uVar21 = uVar8 * uVar9;
  bVar13 = !reduce_w;
  if ((!bVar13 && reduce_h) && reduce_c) {
    Mat::create(b,1,sVar4,opt->blob_allocator);
    local_78.cstep = 0;
    local_78.data = (void *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78.elemsize._4_4_ = 0;
    local_78.elempack = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    Mat::create(&local_78,uVar15,sVar4,opt->workspace_allocator);
    unaff_EBP = -100;
    if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
      if (0 < (int)uVar15) {
        pvVar10 = a->data;
        sVar4 = a->cstep;
        sVar5 = a->elemsize;
        uVar17 = 0;
        do {
          fVar23 = 0.0;
          if (0 < (int)uVar21) {
            uVar16 = 0;
            do {
              fVar1 = *(float *)((long)pvVar10 + uVar16 * 4);
              fVar23 = fVar23 + fVar1 * fVar1;
              uVar16 = uVar16 + 1;
            } while (uVar21 != uVar16);
          }
          *(float *)((long)local_78.data + uVar17 * 4) = fVar23;
          uVar17 = uVar17 + 1;
          pvVar10 = (void *)((long)pvVar10 + sVar4 * sVar5);
        } while (uVar17 != uVar14);
      }
      fVar23 = 0.0;
      if (0 < (int)uVar15) {
        uVar17 = 0;
        do {
          fVar23 = fVar23 + *(float *)((long)local_78.data + uVar17 * 4);
          uVar17 = uVar17 + 1;
        } while (uVar14 != uVar17);
      }
      *(float *)b->data = fVar23;
      unaff_EBP = 0;
    }
    piVar7 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if (local_78.allocator == (Allocator *)0x0) {
          if (local_78.data != (void *)0x0) {
            free(local_78.data);
          }
        }
        else {
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
LAB_00214fe0:
    bVar13 = false;
  }
  else {
    if ((!bVar13 && reduce_h) && !reduce_c) {
      Mat::create(b,uVar15,sVar4,opt->blob_allocator);
      if (0 < (int)uVar15) {
        pvVar10 = a->data;
        sVar4 = a->cstep;
        pvVar12 = b->data;
        sVar5 = a->elemsize;
        uVar17 = 0;
        do {
          fVar23 = 0.0;
          if (0 < (int)uVar21) {
            uVar16 = 0;
            do {
              fVar1 = *(float *)((long)pvVar10 + uVar16 * 4);
              fVar23 = fVar23 + fVar1 * fVar1;
              uVar16 = uVar16 + 1;
            } while (uVar21 != uVar16);
          }
          *(float *)((long)pvVar12 + uVar17 * 4) = fVar23;
          uVar17 = uVar17 + 1;
          pvVar10 = (void *)((long)pvVar10 + sVar4 * sVar5);
        } while (uVar17 != uVar14);
      }
    }
    else {
      lVar11 = (long)(int)uVar9;
      if ((bVar13 || reduce_h) || reduce_c) {
        if ((!bVar13 && !reduce_h) && reduce_c) {
          Mat::create(b,uVar8,sVar4,opt->blob_allocator);
          local_78.cstep = 0;
          local_78.data = (void *)0x0;
          local_78.refcount._0_4_ = 0;
          local_78.refcount._4_4_ = 0;
          local_78.elemsize._0_4_ = 0;
          local_78.elemsize._4_4_ = 0;
          local_78.elempack = 0;
          local_78.allocator = (Allocator *)0x0;
          local_78.dims = 0;
          local_78.w = 0;
          local_78.h = 0;
          local_78.d = 0;
          local_78.c = 0;
          Mat::create(&local_78,1,uVar8,uVar15,sVar4,opt->workspace_allocator);
          unaff_EBP = -100;
          if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
            if (0 < local_78.c * (int)local_78.cstep) {
              memset(local_78.data,0,(ulong)(uint)(local_78.c * (int)local_78.cstep) << 2);
            }
            if (0 < (int)uVar15) {
              pvVar10 = a->data;
              sVar4 = a->cstep;
              sVar5 = a->elemsize;
              uVar19 = 0;
              do {
                if (0 < (int)uVar8) {
                  uVar20 = 0;
                  pvVar12 = pvVar10;
                  do {
                    fVar23 = 0.0;
                    if (0 < (int)uVar9) {
                      uVar22 = 0;
                      do {
                        fVar1 = *(float *)((long)pvVar12 + uVar22 * 4);
                        fVar23 = fVar23 + fVar1 * fVar1;
                        uVar22 = uVar22 + 1;
                      } while (uVar16 != uVar22);
                    }
                    *(float *)((long)local_78.data +
                              uVar20 * 4 +
                              local_78.cstep *
                              CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) *
                              uVar19) = fVar23;
                    uVar20 = uVar20 + 1;
                    pvVar12 = (void *)((long)pvVar12 + lVar11 * 4);
                  } while (uVar20 != uVar17);
                }
                uVar19 = uVar19 + 1;
                pvVar10 = (void *)((long)pvVar10 + sVar4 * sVar5);
              } while (uVar19 != uVar14);
            }
            uVar9 = b->c * (int)b->cstep;
            if (0 < (int)uVar9) {
              memset(b->data,0,(ulong)uVar9 << 2);
            }
            if (0 < (int)uVar15) {
              pvVar10 = b->data;
              uVar16 = 0;
              pvVar12 = local_78.data;
              do {
                if (0 < (int)uVar8) {
                  uVar19 = 0;
                  do {
                    *(float *)((long)pvVar10 + uVar19 * 4) =
                         *(float *)((long)pvVar12 + uVar19 * 4) +
                         *(float *)((long)pvVar10 + uVar19 * 4);
                    uVar19 = uVar19 + 1;
                  } while (uVar17 != uVar19);
                }
                uVar16 = uVar16 + 1;
                pvVar12 = (void *)((long)pvVar12 +
                                  local_78.cstep *
                                  CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
              } while (uVar16 != uVar14);
            }
LAB_00214fd4:
            unaff_EBP = 0;
          }
        }
        else {
          if ((!reduce_h || reduce_w) || !reduce_c) {
            if ((!reduce_w && !reduce_h) && reduce_c) {
              Mat::create(b,uVar9,uVar8,sVar4,opt->blob_allocator);
              uVar9 = b->c * (int)b->cstep;
              if (0 < (int)uVar9) {
                memset(b->data,0,(ulong)uVar9 << 2);
              }
              if (0 < (int)uVar15) {
                pvVar10 = a->data;
                sVar4 = a->cstep;
                pvVar12 = b->data;
                sVar5 = a->elemsize;
                uVar17 = 0;
                unaff_EBP = 0;
                do {
                  if (0 < (int)uVar21) {
                    uVar16 = 0;
                    do {
                      fVar23 = *(float *)((long)pvVar10 + uVar16 * 4);
                      *(float *)((long)pvVar12 + uVar16 * 4) =
                           fVar23 * fVar23 + *(float *)((long)pvVar12 + uVar16 * 4);
                      uVar16 = uVar16 + 1;
                    } while (uVar21 != uVar16);
                  }
                  uVar17 = uVar17 + 1;
                  pvVar10 = (void *)((long)pvVar10 + sVar4 * sVar5);
                  bVar13 = false;
                } while (uVar17 != uVar14);
                goto LAB_00214fe2;
              }
            }
            else {
              bVar13 = true;
              if ((!reduce_h || reduce_w) || reduce_c) goto LAB_00214fe2;
              Mat::create(b,uVar9,uVar15,sVar4,opt->blob_allocator);
              uVar21 = b->c * (int)b->cstep;
              if (0 < (int)uVar21) {
                memset(b->data,0,(ulong)uVar21 << 2);
              }
              if (0 < (int)uVar15) {
                pvVar10 = a->data;
                sVar4 = a->cstep;
                pvVar12 = b->data;
                iVar2 = b->w;
                sVar5 = a->elemsize;
                sVar6 = b->elemsize;
                uVar17 = 0;
                unaff_EBP = 0;
                do {
                  if (0 < (int)uVar8) {
                    uVar15 = 0;
                    pvVar18 = pvVar10;
                    do {
                      if (0 < (int)uVar9) {
                        uVar19 = 0;
                        do {
                          fVar23 = *(float *)((long)pvVar18 + uVar19 * 4);
                          *(float *)((long)pvVar12 + uVar19 * 4) =
                               fVar23 * fVar23 + *(float *)((long)pvVar12 + uVar19 * 4);
                          uVar19 = uVar19 + 1;
                        } while (uVar16 != uVar19);
                      }
                      uVar15 = uVar15 + 1;
                      pvVar18 = (void *)((long)pvVar18 + lVar11 * 4);
                    } while (uVar15 != uVar8);
                  }
                  uVar17 = uVar17 + 1;
                  pvVar10 = (void *)((long)pvVar10 + sVar4 * sVar5);
                  pvVar12 = (void *)((long)pvVar12 + (long)iVar2 * sVar6);
                  bVar13 = false;
                } while (uVar17 != uVar14);
                goto LAB_00214fe2;
              }
            }
            goto LAB_00214cba;
          }
          Mat::create(b,uVar9,sVar4,opt->blob_allocator);
          local_78.cstep = 0;
          local_78.data = (void *)0x0;
          local_78.refcount._0_4_ = 0;
          local_78.refcount._4_4_ = 0;
          local_78.elemsize._0_4_ = 0;
          local_78.elemsize._4_4_ = 0;
          local_78.elempack = 0;
          local_78.allocator = (Allocator *)0x0;
          local_78.dims = 0;
          local_78.w = 0;
          local_78.h = 0;
          local_78.d = 0;
          local_78.c = 0;
          Mat::create(&local_78,uVar9,1,uVar15,sVar4,opt->workspace_allocator);
          unaff_EBP = -100;
          if ((local_78.data != (void *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
            if (0 < local_78.c * (int)local_78.cstep) {
              memset(local_78.data,0,(ulong)(uint)(local_78.c * (int)local_78.cstep) << 2);
            }
            if (0 < (int)uVar15) {
              pvVar10 = a->data;
              sVar4 = a->cstep;
              sVar5 = a->elemsize;
              uVar17 = 0;
              pvVar12 = local_78.data;
              do {
                if (0 < (int)uVar8) {
                  uVar21 = 0;
                  pvVar18 = pvVar10;
                  do {
                    if (0 < (int)uVar9) {
                      uVar19 = 0;
                      do {
                        fVar23 = *(float *)((long)pvVar18 + uVar19 * 4);
                        *(float *)((long)pvVar12 + uVar19 * 4) =
                             fVar23 * fVar23 + *(float *)((long)pvVar12 + uVar19 * 4);
                        uVar19 = uVar19 + 1;
                      } while (uVar16 != uVar19);
                    }
                    uVar21 = uVar21 + 1;
                    pvVar18 = (void *)((long)pvVar18 + lVar11 * 4);
                  } while (uVar21 != uVar8);
                }
                uVar17 = uVar17 + 1;
                pvVar10 = (void *)((long)pvVar10 + sVar4 * sVar5);
                pvVar12 = (void *)((long)pvVar12 +
                                  local_78.cstep *
                                  CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
              } while (uVar17 != uVar14);
            }
            uVar8 = b->c * (int)b->cstep;
            if (0 < (int)uVar8) {
              memset(b->data,0,(ulong)uVar8 << 2);
            }
            if (0 < (int)uVar15) {
              pvVar10 = b->data;
              uVar17 = 0;
              pvVar12 = local_78.data;
              do {
                if (0 < (int)uVar9) {
                  uVar19 = 0;
                  do {
                    *(float *)((long)pvVar10 + uVar19 * 4) =
                         *(float *)((long)pvVar12 + uVar19 * 4) +
                         *(float *)((long)pvVar10 + uVar19 * 4);
                    uVar19 = uVar19 + 1;
                  } while (uVar16 != uVar19);
                }
                uVar17 = uVar17 + 1;
                pvVar12 = (void *)((long)pvVar12 +
                                  local_78.cstep *
                                  CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize));
              } while (uVar17 != uVar14);
            }
            goto LAB_00214fd4;
          }
        }
        Mat::~Mat(&local_78);
        goto LAB_00214fe0;
      }
      Mat::create(b,uVar8,uVar15,sVar4,opt->blob_allocator);
      if (0 < (int)uVar15) {
        pvVar10 = a->data;
        sVar4 = a->cstep;
        iVar2 = b->w;
        sVar5 = b->elemsize;
        sVar6 = a->elemsize;
        pvVar12 = b->data;
        uVar19 = 0;
        do {
          if (0 < (int)uVar8) {
            uVar20 = 0;
            pvVar18 = pvVar10;
            do {
              fVar23 = 0.0;
              if (0 < (int)uVar9) {
                uVar22 = 0;
                do {
                  fVar1 = *(float *)((long)pvVar18 + uVar22 * 4);
                  fVar23 = fVar23 + fVar1 * fVar1;
                  uVar22 = uVar22 + 1;
                } while (uVar16 != uVar22);
              }
              *(float *)((long)pvVar12 + uVar20 * 4 + (long)iVar2 * sVar5 * uVar19) = fVar23;
              uVar20 = uVar20 + 1;
              pvVar18 = (void *)((long)pvVar18 + lVar11 * 4);
            } while (uVar20 != uVar17);
          }
          uVar19 = uVar19 + 1;
          pvVar10 = (void *)((long)pvVar10 + sVar4 * sVar6);
        } while (uVar19 != uVar14);
      }
    }
LAB_00214cba:
    bVar13 = false;
    unaff_EBP = 0;
  }
LAB_00214fe2:
  if (bVar13) {
    return 0;
  }
  return unaff_EBP;
}

Assistant:

static int reduction_op(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_c, const Option& opt)
{
    Op op;
    Op2 op2;

    size_t elemsize = a.elemsize;
    int dims = a.dims;

    if (dims == 1)
    {
        int w = a.w;
        b.create(1, elemsize, opt.blob_allocator);
        const float* ptr = a;

        float sum = v0;
        for (int i = 0; i < w; i++)
        {
            sum = op(sum, ptr[i]);
        }
        b[0] = sum;

        return 0;
    }

    if (dims == 2)
    {
        int w = a.w;
        int h = a.h;

        if (reduce_w && reduce_h)
        {
            // w h -> X X
            b.create(1, elemsize, opt.blob_allocator);

            Mat sums(h, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j = 0; j < w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                sums[i] = sum;
            }

            float sum = v0;
            for (int i = 0; i < h; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && !reduce_h)
        {
            // w h -> X h
            b.create(h, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);

                float sum = v0;
                for (int j = 0; j < w; j++)
                {
                    sum = op(sum, ptr[j]);
                }
                b[i] = sum;
            }
            return 0;
        }

        if (!reduce_w && reduce_h)
        {
            // w h -> w X
            b.create(w, elemsize, opt.blob_allocator);
            b.fill(v0);

            for (int i = 0; i < h; i++)
            {
                const float* ptr = a.row(i);
                for (int j = 0; j < w; j++)
                {
                    b[j] = op(b[j], ptr[j]);
                }
            }
            return 0;
        }
    }

    if (dims == 3)
    {
        int w = a.w;
        int h = a.h;
        int channels = a.c;
        int size = w * h;

        if (reduce_w && reduce_h && reduce_c)
        {
            // w h c -> X X X
            b.create(1, elemsize, opt.blob_allocator);
            Mat sums(channels, elemsize, opt.workspace_allocator);
            if (sums.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i = 0; i < size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                sums[q] = sum;
            }

            float sum = v0;
            for (int i = 0; i < channels; i++)
            {
                sum = op2(sum, sums[i]);
            }
            b[0] = sum;

            return 0;
        }

        if (reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> X X c
            b.create(channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);

                float sum = v0;
                for (int i = 0; i < size; i++)
                {
                    sum = op(sum, ptr[i]);
                }
                b[q] = sum;
            }

            return 0;
        }

        if (reduce_w && !reduce_h && !reduce_c)
        {
            // w h c -> X h c
            b.create(h, channels, elemsize, opt.blob_allocator);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.row(q);

                for (int i = 0; i < h; i++)
                {
                    float sum = v0;
                    for (int j = 0; j < w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    outptr[i] = sum;
                    ptr += w;
                }
            }

            return 0;
        }

        if (reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> X h X
            b.create(h, elemsize, opt.blob_allocator);
            Mat mins(1, h, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i = 0; i < h; i++)
                {
                    float sum = v0;
                    for (int j = 0; j < w; j++)
                    {
                        sum = op(sum, ptr[j]);
                    }
                    mins_ptr[i] = sum;
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int i = 0; i < h; i++)
                {
                    b[i] = op2(b[i], mins_ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && reduce_c)
        {
            // w h c -> w X X
            b.create(w, elemsize, opt.blob_allocator);

            Mat mins(w, 1, channels, elemsize, opt.workspace_allocator);
            if (mins.empty())
                return -100;

            mins.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* mins_ptr = mins.channel(q);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        mins_ptr[j] = op(mins_ptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* mins_ptr = mins.channel(q);
                for (int j = 0; j < w; j++)
                {
                    b[j] = op2(b[j], mins_ptr[j]);
                }
            }

            return 0;
        }

        if (!reduce_w && !reduce_h && reduce_c)
        {
            // w h c -> w h X
            b.create(w, h, elemsize, opt.blob_allocator);

            b.fill(v0);

            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);

                for (int i = 0; i < size; i++)
                {
                    b[i] = op(b[i], ptr[i]);
                }
            }

            return 0;
        }

        if (!reduce_w && reduce_h && !reduce_c)
        {
            // w h c -> w X c
            b.create(w, channels, elemsize, opt.blob_allocator);

            b.fill(v0);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = a.channel(q);
                float* outptr = b.row(q);

                for (int i = 0; i < h; i++)
                {
                    for (int j = 0; j < w; j++)
                    {
                        outptr[j] = op(outptr[j], ptr[j]);
                    }
                    ptr += w;
                }
            }
            return 0;
        }
    }

    return 0;
}